

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O0

string * Limonp::trim(string *s)

{
  string *psVar1;
  string *in_stack_00000040;
  string *in_stack_00000050;
  
  rtrim(in_stack_00000050);
  psVar1 = ltrim(in_stack_00000040);
  return psVar1;
}

Assistant:

inline std::string &trim(std::string &s) 
    {
        return ltrim(rtrim(s));
    }